

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

void Abc_NtkPrintMiniMapping(int *pArray)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pName;
  char *pBuffer;
  int Pos;
  int nLeaves;
  int k;
  int i;
  int nFlops;
  int nNodes;
  int nCos;
  int nCis;
  int *pArray_local;
  
  pBuffer._0_4_ = 4;
  uVar1 = *pArray;
  uVar2 = pArray[1];
  uVar3 = pArray[2];
  printf("Mapped network has %d CIs, %d COs, %d gates, and %d flops.\n",(ulong)uVar1,(ulong)uVar2,
         (ulong)uVar3,(ulong)(uint)pArray[3]);
  printf("The first %d object IDs (from 0 to %d) are reserved for the CIs.\n",(ulong)uVar1,
         (ulong)(uVar1 - 1));
  for (nLeaves = 0; nLeaves < (int)uVar3; nLeaves = nLeaves + 1) {
    printf("Node %d has fanins {",(ulong)(uVar1 + nLeaves));
    iVar4 = pArray[(int)pBuffer];
    for (Pos = 0; pBuffer._0_4_ = (int)pBuffer + 1, Pos < iVar4; Pos = Pos + 1) {
      printf(" %d",(ulong)(uint)pArray[(int)pBuffer]);
    }
    printf(" }\n");
  }
  for (nLeaves = 0; nLeaves < (int)uVar2; nLeaves = nLeaves + 1) {
    printf("CO %d is driven by node %d\n",(ulong)(uint)nLeaves,(ulong)(uint)pArray[(int)pBuffer]);
    pBuffer._0_4_ = (int)pBuffer + 1;
  }
  pName = (char *)(pArray + (int)pBuffer);
  for (nLeaves = 0; nLeaves < (int)uVar3; nLeaves = nLeaves + 1) {
    sVar5 = strlen(pName);
    printf("Node %d has gate \"%s\"\n",(ulong)(uVar1 + nLeaves),pName);
    pName = pName + sVar5 + 1;
  }
  return;
}

Assistant:

void Abc_NtkPrintMiniMapping( int * pArray )
{
    int nCis, nCos, nNodes, nFlops;
    int i, k, nLeaves, Pos = 4;
    char * pBuffer, * pName;
    nCis = pArray[0];
    nCos = pArray[1];
    nNodes = pArray[2];
    nFlops = pArray[3];
    printf( "Mapped network has %d CIs, %d COs, %d gates, and %d flops.\n", nCis, nCos, nNodes, nFlops );
    printf( "The first %d object IDs (from 0 to %d) are reserved for the CIs.\n", nCis, nCis - 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        printf( "Node %d has fanins {", nCis + i );
        nLeaves = pArray[Pos++];
        for ( k = 0; k < nLeaves; k++ )
            printf( " %d", pArray[Pos++] );
        printf( " }\n" );
    }
    for ( i = 0; i < nCos; i++ )
        printf( "CO %d is driven by node %d\n", i, pArray[Pos++] );
    pBuffer = (char *)(pArray + Pos);
    for ( i = 0; i < nNodes; i++ )
    {
        pName = pBuffer;
        pBuffer += strlen(pName) + 1;
        printf( "Node %d has gate \"%s\"\n", nCis + i, pName );
    }
}